

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

TidyOptionImpl * prvTidygetNextOption(TidyDocImpl *doc,TidyIterator *iter)

{
  TidyIterator p_Var1;
  TidyOptionImpl *pTVar2;
  TidyOptionImpl *pTVar3;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var1 = *iter;
    pTVar2 = option_defs + (long)p_Var1;
    if (p_Var1 >= (TidyIterator)0x68 || p_Var1 == (TidyIterator)0x0) {
      pTVar2 = (TidyOptionImpl *)0x0;
    }
    pTVar3 = (TidyOptionImpl *)
             ((long)&p_Var1->_opaque +
             (ulong)(p_Var1 < (TidyIterator)0x68 && p_Var1 != (TidyIterator)0x0));
    if ((TidyOptionImpl *)0x67 < pTVar3) {
      pTVar3 = (TidyOptionImpl *)0x0;
    }
    *iter = (TidyIterator)pTVar3;
    return pTVar2;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c",
                0x709,"const TidyOptionImpl *prvTidygetNextOption(TidyDocImpl *, TidyIterator *)");
}

Assistant:

const TidyOptionImpl*  TY_(getNextOption)( TidyDocImpl* ARG_UNUSED(doc),
                                           TidyIterator* iter )
{
    const TidyOptionImpl* option = NULL;
    size_t optId;
    assert( iter != NULL );
    optId = (size_t) *iter;
    if ( optId > TidyUnknownOption && optId < N_TIDY_OPTIONS )
    {
        option = &option_defs[ optId ];
        optId++;
    }
    *iter = (TidyIterator) ( optId < N_TIDY_OPTIONS ? optId : (size_t)0 );
    return option;
}